

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_b1e7be::HandleVersionMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  size_type sVar2;
  const_reference b;
  long lVar3;
  ulong uVar4;
  cmMakefile *this;
  string local_f0;
  undefined1 local_d0 [8];
  string version_max;
  string version_min;
  size_type dd;
  string *version_string;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"VERSION not given an argument",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0063bed9;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)status_local);
  pcVar1 = local_20;
  if (2 < sVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"VERSION given too many arguments",
               (allocator<char> *)((long)&version_string + 7));
    cmExecutionStatus::SetError(pcVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&version_string + 7));
    args_local._7_1_ = 0;
    goto LAB_0063bed9;
  }
  b = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local,1);
  lVar3 = std::__cxx11::string::find((char *)b,0x1168e8b);
  std::__cxx11::string::substr((ulong)((long)&version_max.field_2 + 8),(ulong)b);
  if (lVar3 == -1) {
    std::__cxx11::string::string((string *)local_d0);
LAB_0063be69:
    this = cmExecutionStatus::GetMakefile(local_20);
    args_local._7_1_ =
         cmMakefile::SetPolicyVersion
                   (this,(string *)((long)&version_max.field_2 + 8),(string *)local_d0);
  }
  else {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)b);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0))
    goto LAB_0063be69;
    pcVar1 = local_20;
    cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[50]>
              (&local_f0,(char (*) [10])0x11325c0,b,
               (char (*) [50])"\" does not have a version on both sides of \"...\".");
    cmExecutionStatus::SetError(pcVar1,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    args_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(version_max.field_2._M_local_buf + 8));
LAB_0063bed9:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleVersionMode(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() <= 1) {
    status.SetError("VERSION not given an argument");
    return false;
  }
  if (args.size() >= 3) {
    status.SetError("VERSION given too many arguments");
    return false;
  }
  std::string const& version_string = args[1];

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    status.SetError(
      cmStrCat("VERSION \"", version_string,
               R"(" does not have a version on both sides of "...".)"));
    return false;
  }

  return status.GetMakefile().SetPolicyVersion(version_min, version_max);
}